

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * cmsys::SystemTools::GetFilenamePath(string *__return_storage_ptr__,string *filename)

{
  char *pcVar1;
  allocator<char> local_59;
  undefined4 local_58;
  allocator<char> local_51;
  long local_50;
  size_type slash_pos;
  undefined1 local_38 [8];
  string fn;
  string *filename_local;
  
  fn.field_2._8_8_ = filename;
  std::__cxx11::string::string((string *)local_38,(string *)filename);
  ConvertToUnixSlashes((string *)local_38);
  local_50 = std::__cxx11::string::rfind((char)local_38,0x2f);
  if (local_50 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"/",&local_51);
    std::allocator<char>::~allocator(&local_51);
  }
  else {
    if (local_50 == 2) {
      pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
      if (*pcVar1 == ':') {
        std::__cxx11::string::resize((ulong)local_38);
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_38);
        goto LAB_001257f6;
      }
    }
    if (local_50 == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_59);
      std::allocator<char>::~allocator(&local_59);
    }
    else {
      std::__cxx11::string::resize((ulong)local_38);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_38);
    }
  }
LAB_001257f6:
  local_58 = 1;
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::GetFilenamePath(const std::string& filename)
{
  std::string fn = filename;
  SystemTools::ConvertToUnixSlashes(fn);

  std::string::size_type slash_pos = fn.rfind('/');
  if (slash_pos == 0) {
    return "/";
  }
  if (slash_pos == 2 && fn[1] == ':') {
    // keep the / after a drive letter
    fn.resize(3);
    return fn;
  }
  if (slash_pos == std::string::npos) {
    return "";
  }
  fn.resize(slash_pos);
  return fn;
}